

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_idwt53_h(opj_dwt_t *dwt,OPJ_INT32 *tiledp)

{
  int *piVar1;
  OPJ_INT32 *__src;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  OPJ_INT32 *pOVar11;
  
  lVar5 = (long)dwt->sn;
  uVar4 = dwt->dn + lVar5;
  uVar2 = (uint)uVar4;
  if (dwt->cas == 0) {
    if (1 < (int)uVar2) {
      __src = dwt->mem;
      iVar3 = tiledp[lVar5];
      iVar9 = *tiledp - (tiledp[lVar5] + 1 >> 1);
      for (lVar6 = 0; lVar6 < (long)(uVar4 - 3); lVar6 = lVar6 + 2) {
        iVar10 = *(int *)((long)tiledp + lVar6 * 2 + lVar5 * 4 + 4);
        iVar8 = *(int *)((long)tiledp + lVar6 * 2 + 4) - (iVar3 + iVar10 + 2 >> 2);
        __src[lVar6] = iVar9;
        __src[lVar6 + 1] = (iVar9 + iVar8 >> 1) + iVar3;
        iVar3 = iVar10;
        iVar9 = iVar8;
      }
      __src[lVar6] = iVar9;
      if ((uVar4 & 1) == 0) {
        lVar5 = -4;
      }
      else {
        iVar10 = tiledp[uVar2 - 1 >> 1] - (iVar3 + 1 >> 1);
        __src[uVar2 - 1] = iVar10;
        iVar9 = iVar10 + iVar9 >> 1;
        lVar5 = -8;
      }
      *(int *)((long)__src + lVar5 + (uVar4 & 0xffffffff) * 4) = iVar9 + iVar3;
LAB_0010c1b9:
      memcpy(tiledp,__src,(uVar4 & 0xffffffff) << 2);
      return;
    }
  }
  else if (uVar2 == 2) {
    piVar1 = dwt->mem;
    iVar3 = *tiledp - (tiledp[lVar5] + 1 >> 1);
    piVar1[1] = iVar3;
    *piVar1 = iVar3 + tiledp[lVar5];
    *(undefined8 *)tiledp = *(undefined8 *)piVar1;
  }
  else if (uVar2 == 1) {
    *tiledp = *tiledp / 2;
  }
  else if (2 < (int)uVar2) {
    __src = dwt->mem;
    iVar3 = tiledp[lVar5 + 1];
    iVar9 = *tiledp - (iVar3 + tiledp[lVar5] + 2 >> 2);
    *__src = tiledp[lVar5] + iVar9;
    pOVar11 = tiledp + 2;
    for (uVar7 = 1; uVar7 < (uVar2 - (uVar2 & 1 ^ 1)) - 2; uVar7 = uVar7 + 2) {
      iVar10 = pOVar11[lVar5];
      iVar8 = pOVar11[-1] - (iVar3 + iVar10 + 2 >> 2);
      __src[uVar7] = iVar9;
      __src[uVar7 + 1] = (iVar9 + iVar8 >> 1) + iVar3;
      pOVar11 = pOVar11 + 1;
      iVar3 = iVar10;
      iVar9 = iVar8;
    }
    __src[uVar7] = iVar9;
    if ((uVar4 & 1) == 0) {
      iVar10 = tiledp[(uVar4 >> 1 & 0x7fffffff) - 1] - (iVar3 + 1 >> 1);
      __src[uVar2 - 2] = (iVar9 + iVar10 >> 1) + iVar3;
    }
    else {
      iVar10 = iVar9 + iVar3;
    }
    __src[(uVar4 & 0xffffffff) - 1] = iVar10;
    goto LAB_0010c1b9;
  }
  return;
}

Assistant:

static void opj_idwt53_h(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    opj_dwt_interleave_h(dwt, tiledp);
    opj_dwt_decode_1(dwt);
    memcpy(tiledp, dwt->mem, (OPJ_UINT32)(dwt->sn + dwt->dn) * sizeof(OPJ_INT32));
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) { /* Left-most sample is on even coordinate */
        if (len > 1) {
            opj_idwt53_h_cas0(dwt->mem, sn, len, tiledp);
        } else {
            /* Unmodified value */
        }
    } else { /* Left-most sample is on odd coordinate */
        if (len == 1) {
            tiledp[0] /= 2;
        } else if (len == 2) {
            OPJ_INT32* out = dwt->mem;
            const OPJ_INT32* in_even = &tiledp[sn];
            const OPJ_INT32* in_odd = &tiledp[0];
            out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
            out[0] = in_even[0] + out[1];
            memcpy(tiledp, dwt->mem, (OPJ_UINT32)len * sizeof(OPJ_INT32));
        } else if (len > 2) {
            opj_idwt53_h_cas1(dwt->mem, sn, len, tiledp);
        }
    }
#endif
}